

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  int *piVar7;
  wchar_t __tmp;
  long lVar8;
  long lVar9;
  size_t size;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  buffer<wchar_t> *c;
  int iVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar16 = (ulong)(uint)specs->width;
  uVar12 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar8 = puVar2[2];
  uVar10 = uVar16 - uVar12;
  if (uVar16 < uVar12 || uVar10 == 0) {
    uVar12 = uVar12 + lVar8;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
    }
    puVar2[2] = uVar12;
    if (0 < (long)f->size_) {
      lVar13 = puVar2[1];
      pcVar14 = f->s;
      lVar6 = f->size_ + 1;
      lVar9 = 0;
      do {
        *(int *)(lVar8 * 4 + lVar13 + lVar9 * 4) = (int)pcVar14[lVar9];
        lVar6 = lVar6 + -1;
        lVar9 = lVar9 + 1;
      } while (1 < lVar6);
    }
  }
  else {
    uVar15 = lVar8 + uVar16;
    if ((ulong)puVar2[3] < uVar15) {
      (**(code **)*puVar2)(puVar2,uVar15);
    }
    puVar2[2] = uVar15;
    auVar5 = _DAT_0020a170;
    auVar4 = _DAT_00207570;
    auVar3 = _DAT_00201020;
    lVar13 = puVar2[1];
    piVar7 = (int *)(lVar13 + lVar8 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar11 = specs->field_0x9 & 0xf;
    if (bVar11 == 3) {
      uVar15 = uVar10 >> 1;
      if (1 < uVar10) {
        piVar7 = piVar7 + uVar15;
        uVar10 = uVar15 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar27._8_4_ = (int)uVar10;
        auVar27._0_8_ = uVar10;
        auVar27._12_4_ = (int)(uVar10 >> 0x20);
        lVar13 = lVar13 + lVar8 * 4;
        lVar8 = 0;
        auVar27 = auVar27 ^ _DAT_00201020;
        do {
          auVar24._8_4_ = (int)lVar8;
          auVar24._0_8_ = lVar8;
          auVar24._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar28 = (auVar24 | auVar4) ^ auVar3;
          iVar22 = auVar27._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar22 && auVar27._0_4_ < auVar28._0_4_ ||
                      iVar22 < auVar28._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + lVar8 * 4) = wVar1;
          }
          if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
              auVar28._12_4_ <= auVar27._12_4_) {
            *(wchar_t *)(lVar13 + 4 + lVar8 * 4) = wVar1;
          }
          auVar24 = (auVar24 | auVar5) ^ auVar3;
          iVar29 = auVar24._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar24._0_4_ <= auVar27._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + lVar8 * 4) = wVar1;
            *(wchar_t *)(lVar13 + 0xc + lVar8 * 4) = wVar1;
          }
          lVar8 = lVar8 + 4;
        } while ((uVar10 - ((uint)(uVar15 + 0x3fffffffffffffff) & 3)) + 4 != lVar8);
      }
      if (0 < (long)f->size_) {
        pcVar14 = f->s;
        lVar8 = f->size_ + 1;
        do {
          *piVar7 = (int)*pcVar14;
          pcVar14 = pcVar14 + 1;
          piVar7 = piVar7 + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      auVar5 = _DAT_0020a170;
      auVar4 = _DAT_00207570;
      auVar3 = _DAT_00201020;
      if (uVar16 != uVar12) {
        uVar10 = (uVar16 * 4 + (uVar12 + uVar15) * -4) - 4;
        auVar28._8_4_ = (int)uVar10;
        auVar28._0_8_ = uVar10;
        auVar28._12_4_ = (int)(uVar10 >> 0x20);
        auVar19._0_8_ = uVar10 >> 2;
        auVar19._8_8_ = auVar28._8_8_ >> 2;
        uVar12 = 0;
        auVar19 = auVar19 ^ _DAT_00201020;
        do {
          auVar25._8_4_ = (int)uVar12;
          auVar25._0_8_ = uVar12;
          auVar25._12_4_ = (int)(uVar12 >> 0x20);
          auVar27 = (auVar25 | auVar4) ^ auVar3;
          iVar22 = auVar19._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar22 && auVar19._0_4_ < auVar27._0_4_ ||
                      iVar22 < auVar27._4_4_) & 1)) {
            piVar7[uVar12] = wVar1;
          }
          if ((auVar27._12_4_ != auVar19._12_4_ || auVar27._8_4_ <= auVar19._8_4_) &&
              auVar27._12_4_ <= auVar19._12_4_) {
            piVar7[uVar12 + 1] = wVar1;
          }
          auVar27 = (auVar25 | auVar5) ^ auVar3;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar19._0_4_)) {
            piVar7[uVar12 + 2] = wVar1;
            piVar7[uVar12 + 3] = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
    }
    else if (bVar11 == 2) {
      if (uVar16 != uVar12) {
        piVar7 = piVar7 + uVar10;
        uVar10 = (uVar16 * 4 + uVar12 * -4) - 4;
        auVar17._8_4_ = (int)uVar10;
        auVar17._0_8_ = uVar10;
        auVar17._12_4_ = (int)(uVar10 >> 0x20);
        auVar18._0_8_ = uVar10 >> 2;
        auVar18._8_8_ = auVar17._8_8_ >> 2;
        lVar13 = lVar13 + lVar8 * 4;
        uVar12 = 0;
        auVar18 = auVar18 ^ _DAT_00201020;
        do {
          auVar23._8_4_ = (int)uVar12;
          auVar23._0_8_ = uVar12;
          auVar23._12_4_ = (int)(uVar12 >> 0x20);
          auVar27 = (auVar23 | auVar4) ^ auVar3;
          iVar22 = auVar18._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar22 && auVar18._0_4_ < auVar27._0_4_ ||
                      iVar22 < auVar27._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + uVar12 * 4) = wVar1;
          }
          if ((auVar27._12_4_ != auVar18._12_4_ || auVar27._8_4_ <= auVar18._8_4_) &&
              auVar27._12_4_ <= auVar18._12_4_) {
            *(wchar_t *)(lVar13 + 4 + uVar12 * 4) = wVar1;
          }
          auVar27 = (auVar23 | auVar5) ^ auVar3;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar18._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + uVar12 * 4) = wVar1;
            *(wchar_t *)(lVar13 + 0xc + uVar12 * 4) = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      if (0 < (long)f->size_) {
        pcVar14 = f->s;
        lVar8 = f->size_ + 1;
        lVar13 = 0;
        do {
          piVar7[lVar13] = (int)pcVar14[lVar13];
          lVar8 = lVar8 + -1;
          lVar13 = lVar13 + 1;
        } while (1 < lVar8);
      }
    }
    else {
      if (0 < (long)f->size_) {
        pcVar14 = f->s;
        lVar8 = f->size_ + 1;
        do {
          *piVar7 = (int)*pcVar14;
          pcVar14 = pcVar14 + 1;
          piVar7 = piVar7 + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      auVar5 = _DAT_0020a170;
      auVar4 = _DAT_00207570;
      auVar3 = _DAT_00201020;
      if (uVar16 != uVar12) {
        uVar10 = (uVar16 * 4 + uVar12 * -4) - 4;
        auVar20._8_4_ = (int)uVar10;
        auVar20._0_8_ = uVar10;
        auVar20._12_4_ = (int)(uVar10 >> 0x20);
        auVar21._0_8_ = uVar10 >> 2;
        auVar21._8_8_ = auVar20._8_8_ >> 2;
        uVar12 = 0;
        auVar21 = auVar21 ^ _DAT_00201020;
        do {
          auVar26._8_4_ = (int)uVar12;
          auVar26._0_8_ = uVar12;
          auVar26._12_4_ = (int)(uVar12 >> 0x20);
          auVar27 = (auVar26 | auVar4) ^ auVar3;
          iVar22 = auVar21._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar22 && auVar21._0_4_ < auVar27._0_4_ ||
                      iVar22 < auVar27._4_4_) & 1)) {
            piVar7[uVar12] = wVar1;
          }
          if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
              auVar27._12_4_ <= auVar21._12_4_) {
            piVar7[uVar12 + 1] = wVar1;
          }
          auVar27 = (auVar26 | auVar5) ^ auVar3;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar21._0_4_)) {
            piVar7[uVar12 + 2] = wVar1;
            piVar7[uVar12 + 3] = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }